

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::HierarchyInstantiationSyntax::HierarchyInstantiationSyntax
          (HierarchyInstantiationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token type,
          ParameterValueAssignmentSyntax *parameters,
          SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *instances,Token semi)

{
  undefined4 uVar1;
  bool bVar2;
  HierarchicalInstanceSyntax *pHVar3;
  SyntaxNode *in_RCX;
  SyntaxNode *in_RDX;
  SyntaxNode *in_RDI;
  undefined8 in_R8;
  HierarchicalInstanceSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *in_stack_ffffffffffffff88;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *this_00;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_58;
  undefined1 in_stack_ffffffffffffffb8 [16];
  
  this_00 = (SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)&stack0x00000008;
  MemberSyntax::MemberSyntax
            (in_stack_ffffffffffffffb8._8_8_,in_stack_ffffffffffffffb8._4_4_,local_58);
  in_RDI[3].parent = in_RDX;
  in_RDI[3].previewNode = in_RCX;
  *(undefined8 *)(in_RDI + 4) = in_R8;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::SeparatedSyntaxList
            (this_00,in_stack_ffffffffffffff88);
  in_RDI[6].previewNode = (SyntaxNode *)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  uVar1 = *(undefined4 *)&(this_00->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  in_RDI[7].kind = (this_00->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&in_RDI[7].field_0x4 = uVar1;
  if (*(long *)(in_RDI + 4) != 0) {
    *(SyntaxNode **)(*(long *)(in_RDI + 4) + 8) = in_RDI;
  }
  *(SyntaxNode **)(in_RDI + 5) = in_RDI;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)0x379b65);
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::end(this_00);
  while( true ) {
    bVar2 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>_>
                      ((self_type *)this_00,
                       (iterator_base<slang::syntax::HierarchicalInstanceSyntax_*> *)
                       in_stack_ffffffffffffff88);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pHVar3 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>,_false>
                          *)0x379ba4);
    (pHVar3->super_SyntaxNode).parent = in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>,_false>
                *)this_00);
  }
  return;
}

Assistant:

HierarchyInstantiationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token type, ParameterValueAssignmentSyntax* parameters, const SeparatedSyntaxList<HierarchicalInstanceSyntax>& instances, Token semi) :
        MemberSyntax(SyntaxKind::HierarchyInstantiation, attributes), type(type), parameters(parameters), instances(instances), semi(semi) {
        if (this->parameters) this->parameters->parent = this;
        this->instances.parent = this;
        for (auto child : this->instances)
            child->parent = this;
    }